

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jansson_helper.c
# Opt level: O1

char * get_mem_options(char *json_string,char *option_name,int *result)

{
  json_t *root;
  char *pcVar1;
  
  *result = -1;
  root = get_root_option_json_object(json_string);
  if (root != (json_t *)0x0) {
    pcVar1 = get_mem_options_inner(root,option_name,result,1);
    return pcVar1;
  }
  return (char *)0x0;
}

Assistant:

char * get_mem_options(const char * json_string, const char * option_name, int * result)
{
	json_t * root;

	*result = -1;
	root = get_root_option_json_object(json_string);
	if (!root)
		return NULL;
	return get_mem_options_inner(root, option_name, result, 1);
}